

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O1

int Bac_BoxBo(Bac_Ntk_t *p,int b,int i)

{
  if ((-1 < b) && (b < (p->vType).nSize)) {
    if (0xffffffbb < ((byte)(p->vType).pArray[(uint)b] >> 1) - 0x49) {
      return b + i + 1;
    }
    __assert_fail("Bac_ObjIsBox(p, b)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0x134,"int Bac_BoxBo(Bac_Ntk_t *, int, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

static inline int            Bac_BoxBo( Bac_Ntk_t * p, int b, int i )        { assert(Bac_ObjIsBox(p, b)); return b + 1 + i;                                               }